

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMInstPrinter.c
# Opt level: O3

void EVM_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  char *fmt;
  ulong uVar1;
  
  fmt = EVM_insn_name((csh)MI->csh,MI->Opcode);
  SStream_concat(O,fmt);
  if ((MI->Opcode & 0xffffffe0) == 0x60) {
    SStream_concat0(O,anon_var_dwarf_350d45 + 0x11);
    if (MI->Opcode != 0x5f) {
      uVar1 = 0;
      do {
        SStream_concat(O,"%02x",(ulong)MI->evm_data[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < MI->Opcode - 0x5f);
    }
  }
  return;
}

Assistant:

void EVM_printInst(MCInst *MI, struct SStream *O, void *PrinterInfo)
{
	SStream_concat(O, EVM_insn_name((csh)MI->csh, MI->Opcode));

	if (MI->Opcode >= EVM_INS_PUSH1 && MI->Opcode <= EVM_INS_PUSH32) {
		unsigned int i;

		SStream_concat0(O, "\t");
		for (i = 0; i < MI->Opcode - EVM_INS_PUSH1 + 1; i++) {
			SStream_concat(O, "%02x", MI->evm_data[i]);
		}
	}
}